

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssl_shim.cc
# Opt level: O0

bool DoExchange(UniquePtr<SSL_SESSION> *out_session,UniquePtr<SSL> *ssl_uniqueptr,TestConfig *config
               ,bool is_resume,bool is_retry,SettingsWriter *writer)

{
  allocator<unsigned_char> *this;
  ulong in_len;
  FILE *pFVar1;
  TestState *dst;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  SSL_CTX *pSVar8;
  uchar *puVar9;
  size_type sVar10;
  char *pcVar11;
  size_t llen;
  uchar *p;
  size_t plen;
  size_t sVar12;
  size_t sVar13;
  pointer puVar14;
  byte *pbVar15;
  pointer psVar16;
  bool *pbVar17;
  SSL_SESSION *session;
  byte local_245;
  bool local_151;
  int local_12c;
  bool actual;
  bool got_early_data;
  bool expect_new_session;
  int i_1;
  int err;
  int n;
  __array buf_1;
  size_t read_size;
  int write_ret;
  bool pending_initial_write;
  size_t len;
  size_t i;
  __array buf;
  size_t tls_unique_len;
  uint8_t tls_unique [16];
  undefined1 local_d0 [6];
  uint16_t secret_len;
  Span<const_unsigned_char> write_secret;
  Span<const_unsigned_char> read_secret;
  undefined1 local_a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  anon_class_8_1_ba1d796c local_80;
  function<int_()> local_78;
  TestState *local_58;
  TestState *test_state;
  SSL_CTX *session_ctx;
  SSL *ssl;
  SettingsWriter *pSStack_38;
  int ret;
  SettingsWriter *writer_local;
  bool is_retry_local;
  TestConfig *pTStack_28;
  bool is_resume_local;
  TestConfig *config_local;
  UniquePtr<SSL> *ssl_uniqueptr_local;
  UniquePtr<SSL_SESSION> *out_session_local;
  
  pSStack_38 = writer;
  writer_local._6_1_ = is_retry;
  writer_local._7_1_ = is_resume;
  pTStack_28 = config;
  config_local = (TestConfig *)ssl_uniqueptr;
  ssl_uniqueptr_local = (UniquePtr<SSL> *)out_session;
  session_ctx = (SSL_CTX *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(ssl_uniqueptr);
  test_state = (TestState *)SSL_get_SSL_CTX((SSL *)session_ctx);
  local_58 = GetTestState((SSL *)session_ctx);
  if ((pTStack_28->implicit_handshake & 1U) == 0) {
    if ((pTStack_28->handoff & 1U) != 0) {
      bVar2 = DoSplitHandshake((UniquePtr<SSL> *)config_local,pSStack_38,
                               (bool)(writer_local._7_1_ & 1));
      if (!bVar2) {
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      session_ctx = (SSL_CTX *)
                    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)config_local);
      local_58 = GetTestState((SSL *)session_ctx);
    }
    do {
      pSVar8 = session_ctx;
      local_80.ssl = (SSL **)&session_ctx;
      std::function<int()>::
      function<DoExchange(std::unique_ptr<ssl_session_st,bssl::internal::Deleter>*,std::unique_ptr<ssl_st,bssl::internal::Deleter>*,TestConfig_const*,bool,bool,SettingsWriter*)::__0,void>
                ((function<int()> *)&local_78,&local_80);
      ssl._4_4_ = CheckIdempotentError("SSL_do_handshake",(SSL *)pSVar8,&local_78);
      std::function<int_()>::~function(&local_78);
      bVar2 = RetryAsync((SSL *)session_ctx,ssl._4_4_);
    } while (bVar2);
    if ((pTStack_28->forbid_renegotiation_after_handshake & 1U) != 0) {
      SSL_set_renegotiate_mode((SSL *)session_ctx,ssl_renegotiate_never);
    }
    if ((ssl._4_4_ != 1) ||
       (bVar2 = CheckHandshakeProperties
                          ((SSL *)session_ctx,(bool)(writer_local._7_1_ & 1),pTStack_28),
       dst = test_state, !bVar2)) {
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
    pSVar8 = (SSL_CTX *)SSL_get_SSL_CTX((SSL *)session_ctx);
    CopySessions((SSL_CTX *)dst,pSVar8);
    if (((writer_local._7_1_ & 1) != 0) &&
       (((((writer_local._6_1_ & 1) == 0 && ((pTStack_28->is_server & 1U) == 0)) &&
         ((pTStack_28->expect_no_offer_early_data & 1U) != 0)) &&
        (iVar4 = SSL_in_early_data((SSL *)session_ctx), iVar4 != 0)))) {
      fprintf(_stderr,"Client unexpectedly offered early data.\n");
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
    if ((pTStack_28->handshake_twice & 1U) != 0) {
      do {
        ssl._4_4_ = SSL_do_handshake((SSL *)session_ctx);
        bVar2 = RetryAsync((SSL *)session_ctx,ssl._4_4_);
      } while (bVar2);
      if (ssl._4_4_ != 1) {
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
    }
    if (((pTStack_28->no_op_extra_handshake & 1U) != 0) &&
       (iVar4 = SSL_do_handshake((SSL *)session_ctx), iVar4 != 1)) {
      fprintf(_stderr,"Extra SSL_do_handshake was not a no-op.\n");
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
    if (pTStack_28->early_write_after_message != 0) {
      iVar4 = SSL_in_early_data((SSL *)session_ctx);
      if ((iVar4 == 0) || ((pTStack_28->is_server & 1U) != 0)) {
        fprintf(_stderr,"-early-write-after-message only works for 0-RTT connections on servers.\n")
        ;
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      if (((pTStack_28->shim_writes_first & 1U) == 0) || ((pTStack_28->async & 1U) == 0)) {
        fprintf(_stderr,"-early-write-after-message requires -shim-writes-first and -async.\n");
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      do {
        ssl._4_4_ = SSL_do_handshake((SSL *)session_ctx);
        local_151 = false;
        if (local_58->last_message_received != pTStack_28->early_write_after_message) {
          local_151 = RetryAsync((SSL *)session_ctx,ssl._4_4_);
        }
      } while (local_151 != false);
      if (ssl._4_4_ == 1) {
        fprintf(_stderr,"Handshake unexpectedly succeeded.\n");
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      if (local_58->last_message_received != pTStack_28->early_write_after_message) {
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
    }
    local_58->got_new_session = false;
  }
  if (0 < pTStack_28->export_keying_material) {
    iVar4 = pTStack_28->export_keying_material;
    this = (allocator<unsigned_char> *)((long)&read_secret.size_ + 7);
    std::allocator<unsigned_char>::allocator(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,(long)iVar4,this);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)((long)&read_secret.size_ + 7));
    pSVar8 = session_ctx;
    puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    pcVar11 = (char *)std::__cxx11::string::data();
    llen = std::__cxx11::string::size();
    p = (uchar *)std::__cxx11::string::data();
    plen = std::__cxx11::string::size();
    iVar4 = SSL_export_keying_material
                      ((SSL *)pSVar8,puVar9,sVar10,pcVar11,llen,p,plen,
                       pTStack_28->use_export_context & 1);
    pSVar8 = session_ctx;
    if (iVar4 == 0) {
      fprintf(_stderr,"failed to export keying material\n");
      out_session_local._7_1_ = 0;
      read_secret.size_._0_4_ = 1;
    }
    else {
      puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
      iVar4 = WriteAll((SSL *)pSVar8,puVar9,sVar10);
      if (iVar4 < 0) {
        out_session_local._7_1_ = 0;
        read_secret.size_._0_4_ = 1;
      }
      else {
        read_secret.size_._0_4_ = 0;
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    if ((int)read_secret.size_ != 0) goto LAB_00122401;
  }
  if ((pTStack_28->export_traffic_secrets & 1U) != 0) {
    bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&write_secret.size_);
    bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_d0);
    bVar2 = bssl::SSL_get_traffic_secrets
                      ((SSL *)session_ctx,(Span<const_unsigned_char> *)&write_secret.size_,
                       (Span<const_unsigned_char> *)local_d0);
    if (!bVar2) {
      fprintf(_stderr,"failed to export traffic secrets\n");
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
    sVar12 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&write_secret.size_)
    ;
    if (0xffff < sVar12) {
      __assert_fail("read_secret.size() <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc"
                    ,0x449,
                    "bool DoExchange(bssl::UniquePtr<SSL_SESSION> *, bssl::UniquePtr<SSL> *, const TestConfig *, bool, bool, SettingsWriter *)"
                   );
    }
    sVar12 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_d0);
    sVar13 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&write_secret.size_)
    ;
    if (sVar12 != sVar13) {
      __assert_fail("write_secret.size() == read_secret.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc"
                    ,0x44a,
                    "bool DoExchange(bssl::UniquePtr<SSL_SESSION> *, bssl::UniquePtr<SSL> *, const TestConfig *, bool, bool, SettingsWriter *)"
                   );
    }
    sVar12 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&write_secret.size_)
    ;
    tls_unique._14_2_ = (undefined2)sVar12;
    iVar4 = WriteAll((SSL *)session_ctx,tls_unique + 0xe,2);
    pSVar8 = session_ctx;
    if (-1 < iVar4) {
      puVar9 = bssl::Span<const_unsigned_char>::data
                         ((Span<const_unsigned_char> *)&write_secret.size_);
      sVar12 = bssl::Span<const_unsigned_char>::size
                         ((Span<const_unsigned_char> *)&write_secret.size_);
      iVar4 = WriteAll((SSL *)pSVar8,puVar9,sVar12);
      pSVar8 = session_ctx;
      if (-1 < iVar4) {
        puVar9 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_d0);
        sVar12 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_d0);
        iVar4 = WriteAll((SSL *)pSVar8,puVar9,sVar12);
        if (-1 < iVar4) goto LAB_001217e7;
      }
    }
    out_session_local._7_1_ = 0;
    goto LAB_00122401;
  }
LAB_001217e7:
  if ((pTStack_28->tls_unique & 1U) != 0) {
    iVar4 = SSL_get_tls_unique((SSL *)session_ctx,(uint8_t *)&tls_unique_len,(size_t *)&buf,0x10);
    if (iVar4 == 0) {
      fprintf(_stderr,"failed to get tls-unique\n");
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
    if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
        buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0xc) {
      fprintf(_stderr,"expected 12 bytes of tls-unique but got %u",
              (ulong)buf._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl & 0xffffffff);
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
    iVar4 = WriteAll((SSL *)session_ctx,&tls_unique_len,0xc);
    if (iVar4 < 0) {
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
  }
  if ((pTStack_28->send_alert & 1U) != 0) {
    iVar4 = DoSendFatalAlert((SSL *)session_ctx,'\x1e');
    if (iVar4 < 0) {
      out_session_local._7_1_ = 0;
    }
    else {
      out_session_local._7_1_ = 1;
    }
    goto LAB_00122401;
  }
  if ((pTStack_28->write_different_record_sizes & 1U) == 0) {
    bVar2 = false;
    if ((pTStack_28->read_with_unfinished_write & 1U) == 0) {
      if (((pTStack_28->shim_writes_first & 1U) != 0) &&
         (iVar4 = WriteAll((SSL *)session_ctx,"hello",5), iVar4 < 0)) {
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
    }
    else {
      if ((pTStack_28->async & 1U) == 0) {
        fprintf(_stderr,"-read-with-unfinished-write requires -async.\n");
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      if ((pTStack_28->is_quic & 1U) != 0) {
        fprintf(_stderr,"-read-with-unfinished-write is incompatible with QUIC.\n");
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      AsyncBioAllowWrite(local_58->async_bio,1);
      iVar4 = SSL_write((SSL *)session_ctx,"hello",5);
      iVar4 = SSL_get_error((SSL *)session_ctx,iVar4);
      if (iVar4 != 3) {
        fprintf(_stderr,"Failed to leave unfinished write.\n");
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      bVar2 = true;
    }
    if ((pTStack_28->shim_shuts_down & 1U) == 0) {
      do {
        if (((pTStack_28->key_update_before_read & 1U) != 0) &&
           (iVar4 = SSL_key_update((SSL *)session_ctx,0), iVar4 == 0)) {
          fprintf(_stderr,"SSL_key_update failed.\n");
          out_session_local._7_1_ = 0;
          goto LAB_00122401;
        }
        iVar4 = 0x200;
        if ((pTStack_28->is_dtls & 1U) != 0) {
          iVar4 = 0x4000;
        }
        if (0 < pTStack_28->read_size) {
          iVar4 = pTStack_28->read_size;
        }
        buf_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             (long)iVar4;
        std::make_unique<unsigned_char[]>((size_t)&err);
        pSVar8 = session_ctx;
        puVar14 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &err);
        iVar4 = DoRead((SSL *)pSVar8,puVar14,
                       (size_t)buf_1._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        iVar5 = SSL_get_error((SSL *)session_ctx,iVar4);
        if ((iVar5 == 6) || ((iVar4 == 0 && (iVar5 == 5)))) {
          if (iVar4 == 0) {
            read_secret.size_._0_4_ = 0xb;
          }
          else {
            fprintf(_stderr,"Invalid SSL_get_error output\n");
            out_session_local._7_1_ = 0;
            read_secret.size_._0_4_ = 1;
          }
        }
        else if (iVar5 == 0) {
          if (iVar4 < 1) {
            fprintf(_stderr,"Invalid SSL_get_error output\n");
            out_session_local._7_1_ = 0;
            read_secret.size_._0_4_ = 1;
          }
          else if (((((pTStack_28->is_server & 1U) == 0) && ((writer_local._7_1_ & 1) != 0)) &&
                   ((writer_local._6_1_ & 1) == 0)) &&
                  ((pTStack_28->expect_reject_early_data & 1U) != 0)) {
            fprintf(_stderr,"Unexpectedly received data instead of 0-RTT reject.\n");
            out_session_local._7_1_ = 0;
            read_secret.size_._0_4_ = 1;
          }
          else if (((local_58->handshake_done & 1U) == 0) &&
                  (iVar5 = SSL_early_data_accepted((SSL *)session_ctx), iVar5 == 0)) {
            fprintf(_stderr,"handshake was not completed after SSL_read\n");
            out_session_local._7_1_ = 0;
            read_secret.size_._0_4_ = 1;
          }
          else {
            if (bVar2) {
              iVar5 = WriteAll((SSL *)session_ctx,"hello",5);
              if (iVar5 < 0) {
                out_session_local._7_1_ = 0;
                read_secret.size_._0_4_ = 1;
                goto LAB_00121f63;
              }
              bVar2 = false;
            }
            if (((pTStack_28->key_update & 1U) == 0) ||
               (iVar5 = SSL_key_update((SSL *)session_ctx,0), iVar5 != 0)) {
              for (local_12c = 0; pSVar8 = session_ctx, local_12c < iVar4; local_12c = local_12c + 1
                  ) {
                pbVar15 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                          operator[]((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                      *)&err,(long)local_12c);
                *pbVar15 = *pbVar15 ^ 0xff;
              }
              puVar14 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                    *)&err);
              iVar4 = WriteAll((SSL *)pSVar8,puVar14,(long)iVar4);
              if (iVar4 < 0) {
                out_session_local._7_1_ = 0;
                read_secret.size_._0_4_ = 1;
              }
              else {
                read_secret.size_._0_4_ = 0;
              }
            }
            else {
              fprintf(_stderr,"SSL_key_update failed.\n");
              out_session_local._7_1_ = 0;
              read_secret.size_._0_4_ = 1;
            }
          }
        }
        else if (iVar4 < 1) {
          out_session_local._7_1_ = 0;
          read_secret.size_._0_4_ = 1;
        }
        else {
          fprintf(_stderr,"Invalid SSL_get_error output\n");
          out_session_local._7_1_ = 0;
          read_secret.size_._0_4_ = 1;
        }
LAB_00121f63:
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&err);
      } while ((int)read_secret.size_ == 0);
      if ((int)read_secret.size_ == 1) goto LAB_00122401;
    }
  }
  else {
    if ((pTStack_28->is_dtls & 1U) != 0) {
      fprintf(_stderr,"write_different_record_sizes not supported for DTLS\n");
      out_session_local._7_1_ = 0;
      goto LAB_00122401;
    }
    std::make_unique<unsigned_char[]>((size_t)&i);
    puVar14 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&i);
    OPENSSL_memset(puVar14,0x42,0x8001);
    for (len = 0; pSVar8 = session_ctx, len < 0xb; len = len + 1) {
      in_len = DoExchange::kRecordSizes[len];
      if (0x8001 < in_len) {
        fprintf(_stderr,"Bad kRecordSizes value.\n");
        out_session_local._7_1_ = 0;
        read_secret.size_._0_4_ = 1;
        goto LAB_00121a2f;
      }
      puVar14 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                          ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&i)
      ;
      iVar4 = WriteAll((SSL *)pSVar8,puVar14,in_len);
      if (iVar4 < 0) {
        out_session_local._7_1_ = 0;
        read_secret.size_._0_4_ = 1;
        goto LAB_00121a2f;
      }
    }
    read_secret.size_._0_4_ = 0;
LAB_00121a2f:
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&i);
    if ((int)read_secret.size_ != 0) goto LAB_00122401;
  }
  if (((((pTStack_28->is_server & 1U) == 0) && ((pTStack_28->false_start & 1U) == 0)) &&
      ((pTStack_28->implicit_handshake & 1U) == 0)) &&
     ((uVar3 = GetProtocolVersion((SSL *)session_ctx), uVar3 < 0x304 &&
      ((local_58->got_new_session & 1U) != 0)))) {
    fprintf(_stderr,"new session was established after the handshake\n");
    out_session_local._7_1_ = 0;
  }
  else {
    uVar3 = GetProtocolVersion((SSL *)session_ctx);
    if ((0x303 < uVar3) && ((pTStack_28->is_server & 1U) == 0)) {
      local_245 = 0;
      if (((pTStack_28->expect_no_session & 1U) == 0) &&
         (local_245 = 0, (pTStack_28->shim_shuts_down & 1U) == 0)) {
        bVar2 = IsPAKE((SSL *)session_ctx);
        local_245 = bVar2 ^ 0xff;
      }
      if ((local_245 & 1) != (local_58->got_new_session & 1U)) {
        pcVar11 = " not";
        if ((local_58->got_new_session & 1U) != 0) {
          pcVar11 = "";
        }
        fprintf(_stderr,"new session was%s cached, but we expected the opposite\n",pcVar11);
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      if ((local_245 & 1) != 0) {
        psVar16 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                            (&local_58->new_session);
        iVar4 = SSL_SESSION_early_data_capable(psVar16);
        if ((bool)(pTStack_28->expect_ticket_supports_early_data & 1U) != (iVar4 != 0)) {
          pcVar11 = " not";
          if (iVar4 != 0) {
            pcVar11 = "";
          }
          fprintf(_stderr,"new session did%s support early data, but we expected the opposite\n",
                  pcVar11);
          out_session_local._7_1_ = 0;
          goto LAB_00122401;
        }
        bVar2 = std::optional<bool>::has_value(&pTStack_28->expect_resumable_across_names);
        if (bVar2) {
          psVar16 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                              (&local_58->new_session);
          iVar4 = SSL_SESSION_is_resumable_across_names(psVar16);
          pbVar17 = std::optional<bool>::value(&pTStack_28->expect_resumable_across_names);
          if ((bool)(*pbVar17 & 1U) != (iVar4 != 0)) {
            pcVar11 = " not";
            if (iVar4 != 0) {
              pcVar11 = "";
            }
            fprintf(_stderr,
                    "new session did%s support cross-name resumption, but we expected the opposite\n"
                    ,pcVar11);
            out_session_local._7_1_ = 0;
            goto LAB_00122401;
          }
        }
      }
    }
    if (ssl_uniqueptr_local != (UniquePtr<SSL> *)0x0) {
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)ssl_uniqueptr_local,
                 &local_58->new_session);
    }
    ssl._4_4_ = DoShutdown((SSL *)session_ctx);
    if (((pTStack_28->shim_shuts_down & 1U) != 0) && ((pTStack_28->check_close_notify & 1U) != 0)) {
      if (ssl._4_4_ != 0) {
        fprintf(_stderr,"Unexpected SSL_shutdown result: %d != 0\n",(ulong)ssl._4_4_);
        out_session_local._7_1_ = 0;
        goto LAB_00122401;
      }
      ssl._4_4_ = DoShutdown((SSL *)session_ctx);
    }
    if (ssl._4_4_ == 1) {
      iVar4 = SSL_total_renegotiations((SSL *)session_ctx);
      if (0 < iVar4) {
        session = SSL_get_session((SSL *)session_ctx);
        iVar4 = SSL_SESSION_is_resumable((SSL_SESSION *)session);
        if (iVar4 != 0) {
          fprintf(_stderr,"Renegotiations should never produce resumable sessions.\n");
          out_session_local._7_1_ = 0;
          goto LAB_00122401;
        }
        iVar4 = SSL_session_reused((SSL *)session_ctx);
        if (iVar4 != 0) {
          fprintf(_stderr,"Renegotiations should never resume sessions.\n");
          out_session_local._7_1_ = 0;
          goto LAB_00122401;
        }
        bVar2 = CheckAuthProperties((SSL *)session_ctx,(bool)(writer_local._7_1_ & 1),pTStack_28);
        if (!bVar2) {
          out_session_local._7_1_ = 0;
          goto LAB_00122401;
        }
      }
      iVar4 = SSL_total_renegotiations((SSL *)session_ctx);
      pFVar1 = _stderr;
      if (iVar4 == pTStack_28->expect_total_renegotiations) {
        if (((pTStack_28->renegotiate_explicit & 1U) == 0) ||
           (iVar4 = SSL_total_renegotiations((SSL *)session_ctx), pFVar1 = _stderr,
           iVar4 == local_58->explicit_renegotiates)) {
          out_session_local._7_1_ = 1;
        }
        else {
          uVar7 = SSL_total_renegotiations((SSL *)session_ctx);
          fprintf(pFVar1,"Performed %d renegotiations, but triggered %d of them\n",(ulong)uVar7,
                  (ulong)(uint)local_58->explicit_renegotiates);
          out_session_local._7_1_ = 0;
        }
      }
      else {
        uVar7 = pTStack_28->expect_total_renegotiations;
        uVar6 = SSL_total_renegotiations((SSL *)session_ctx);
        fprintf(pFVar1,"Expected %d renegotiations, got %d\n",(ulong)uVar7,(ulong)uVar6);
        out_session_local._7_1_ = 0;
      }
    }
    else {
      fprintf(_stderr,"Unexpected SSL_shutdown result: %d != 1\n",(ulong)ssl._4_4_);
      out_session_local._7_1_ = 0;
    }
  }
LAB_00122401:
  return (bool)(out_session_local._7_1_ & 1);
}

Assistant:

static bool DoExchange(bssl::UniquePtr<SSL_SESSION> *out_session,
                       bssl::UniquePtr<SSL> *ssl_uniqueptr,
                       const TestConfig *config, bool is_resume, bool is_retry,
                       SettingsWriter *writer) {
  int ret;
  SSL *ssl = ssl_uniqueptr->get();
  SSL_CTX *session_ctx = SSL_get_SSL_CTX(ssl);
  TestState *test_state = GetTestState(ssl);

  if (!config->implicit_handshake) {
    if (config->handoff) {
#if defined(HANDSHAKER_SUPPORTED)
      if (!DoSplitHandshake(ssl_uniqueptr, writer, is_resume)) {
        return false;
      }
      ssl = ssl_uniqueptr->get();
      test_state = GetTestState(ssl);
#else
      fprintf(stderr, "The external handshaker can only be used on Linux\n");
      return false;
#endif
    }

    do {
      ret = CheckIdempotentError("SSL_do_handshake", ssl, [&]() -> int {
        return SSL_do_handshake(ssl);
      });
    } while (RetryAsync(ssl, ret));

    if (config->forbid_renegotiation_after_handshake) {
      SSL_set_renegotiate_mode(ssl, ssl_renegotiate_never);
    }

    if (ret != 1 || !CheckHandshakeProperties(ssl, is_resume, config)) {
      return false;
    }

    CopySessions(session_ctx, SSL_get_SSL_CTX(ssl));

    if (is_resume && !is_retry && !config->is_server &&
        config->expect_no_offer_early_data && SSL_in_early_data(ssl)) {
      fprintf(stderr, "Client unexpectedly offered early data.\n");
      return false;
    }

    if (config->handshake_twice) {
      do {
        ret = SSL_do_handshake(ssl);
      } while (RetryAsync(ssl, ret));
      if (ret != 1) {
        return false;
      }
    }

    // Skip the |config->async| logic as this should be a no-op.
    if (config->no_op_extra_handshake && SSL_do_handshake(ssl) != 1) {
      fprintf(stderr, "Extra SSL_do_handshake was not a no-op.\n");
      return false;
    }

    if (config->early_write_after_message != 0) {
      if (!SSL_in_early_data(ssl) || config->is_server) {
        fprintf(stderr,
                "-early-write-after-message only works for 0-RTT connections "
                "on servers.\n");
        return false;
      }
      if (!config->shim_writes_first || !config->async) {
        fprintf(stderr,
                "-early-write-after-message requires -shim-writes-first and "
                "-async.\n");
        return false;
      }
      // Run the handshake until the specified message. Note that, if a
      // handshake record contains multiple messages, |SSL_do_handshake| usually
      // processes both atomically. The test must ensure there is a record
      // boundary after the desired message. Checking |last_message_received|
      // confirms this.
      do {
        ret = SSL_do_handshake(ssl);
      } while (test_state->last_message_received !=
                   config->early_write_after_message &&
               RetryAsync(ssl, ret));
      if (ret == 1) {
        fprintf(stderr, "Handshake unexpectedly succeeded.\n");
        return false;
      }
      if (test_state->last_message_received !=
          config->early_write_after_message) {
        // The handshake failed before we saw the target message. The generic
        // error-handling logic in the caller will print the error.
        return false;
      }
    }

    // Reset the state to assert later that the callback isn't called in
    // renegotations.
    test_state->got_new_session = false;
  }

  if (config->export_keying_material > 0) {
    std::vector<uint8_t> result(
        static_cast<size_t>(config->export_keying_material));
    if (!SSL_export_keying_material(
            ssl, result.data(), result.size(), config->export_label.data(),
            config->export_label.size(),
            reinterpret_cast<const uint8_t *>(config->export_context.data()),
            config->export_context.size(), config->use_export_context)) {
      fprintf(stderr, "failed to export keying material\n");
      return false;
    }
    if (WriteAll(ssl, result.data(), result.size()) < 0) {
      return false;
    }
  }

  if (config->export_traffic_secrets) {
    bssl::Span<const uint8_t> read_secret, write_secret;
    if (!SSL_get_traffic_secrets(ssl, &read_secret, &write_secret)) {
      fprintf(stderr, "failed to export traffic secrets\n");
      return false;
    }

    assert(read_secret.size() <= 0xffff);
    assert(write_secret.size() == read_secret.size());
    const uint16_t secret_len = read_secret.size();
    if (WriteAll(ssl, &secret_len, sizeof(secret_len)) < 0 ||
        WriteAll(ssl, read_secret.data(), read_secret.size()) < 0 ||
        WriteAll(ssl, write_secret.data(), write_secret.size()) < 0) {
      return false;
    }
  }

  if (config->tls_unique) {
    uint8_t tls_unique[16];
    size_t tls_unique_len;
    if (!SSL_get_tls_unique(ssl, tls_unique, &tls_unique_len,
                            sizeof(tls_unique))) {
      fprintf(stderr, "failed to get tls-unique\n");
      return false;
    }

    if (tls_unique_len != 12) {
      fprintf(stderr, "expected 12 bytes of tls-unique but got %u",
              static_cast<unsigned>(tls_unique_len));
      return false;
    }

    if (WriteAll(ssl, tls_unique, tls_unique_len) < 0) {
      return false;
    }
  }

  if (config->send_alert) {
    if (DoSendFatalAlert(ssl, SSL_AD_DECOMPRESSION_FAILURE) < 0) {
      return false;
    }
    return true;
  }

  if (config->write_different_record_sizes) {
    if (config->is_dtls) {
      fprintf(stderr, "write_different_record_sizes not supported for DTLS\n");
      return false;
    }
    // This mode writes a number of different record sizes in an attempt to
    // trip up the CBC record splitting code.
    static const size_t kBufLen = 32769;
    auto buf = std::make_unique<uint8_t[]>(kBufLen);
    OPENSSL_memset(buf.get(), 0x42, kBufLen);
    static const size_t kRecordSizes[] = {
        0, 1, 255, 256, 257, 16383, 16384, 16385, 32767, 32768, 32769};
    for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kRecordSizes); i++) {
      const size_t len = kRecordSizes[i];
      if (len > kBufLen) {
        fprintf(stderr, "Bad kRecordSizes value.\n");
        return false;
      }
      if (WriteAll(ssl, buf.get(), len) < 0) {
        return false;
      }
    }
  } else {
    static const char kInitialWrite[] = "hello";
    bool pending_initial_write = false;
    if (config->read_with_unfinished_write) {
      if (!config->async) {
        fprintf(stderr, "-read-with-unfinished-write requires -async.\n");
        return false;
      }
      if (config->is_quic) {
        fprintf(stderr,
                "-read-with-unfinished-write is incompatible with QUIC.\n");
        return false;
      }

      // Let only one byte of the record through.
      AsyncBioAllowWrite(test_state->async_bio, 1);
      int write_ret = SSL_write(ssl, kInitialWrite, strlen(kInitialWrite));
      if (SSL_get_error(ssl, write_ret) != SSL_ERROR_WANT_WRITE) {
        fprintf(stderr, "Failed to leave unfinished write.\n");
        return false;
      }
      pending_initial_write = true;
    } else if (config->shim_writes_first) {
      if (WriteAll(ssl, kInitialWrite, strlen(kInitialWrite)) < 0) {
        return false;
      }
    }
    if (!config->shim_shuts_down) {
      for (;;) {
        if (config->key_update_before_read &&
            !SSL_key_update(ssl, SSL_KEY_UPDATE_NOT_REQUESTED)) {
          fprintf(stderr, "SSL_key_update failed.\n");
          return false;
        }

        // Read only 512 bytes at a time in TLS to ensure records may be
        // returned in multiple reads.
        size_t read_size = config->is_dtls ? 16384 : 512;
        if (config->read_size > 0) {
          read_size = config->read_size;
        }
        auto buf = std::make_unique<uint8_t[]>(read_size);

        int n = DoRead(ssl, buf.get(), read_size);
        int err = SSL_get_error(ssl, n);
        if (err == SSL_ERROR_ZERO_RETURN ||
            (n == 0 && err == SSL_ERROR_SYSCALL)) {
          if (n != 0) {
            fprintf(stderr, "Invalid SSL_get_error output\n");
            return false;
          }
          // Stop on either clean or unclean shutdown.
          break;
        } else if (err != SSL_ERROR_NONE) {
          if (n > 0) {
            fprintf(stderr, "Invalid SSL_get_error output\n");
            return false;
          }
          return false;
        }
        // Successfully read data.
        if (n <= 0) {
          fprintf(stderr, "Invalid SSL_get_error output\n");
          return false;
        }

        if (!config->is_server && is_resume && !is_retry &&
            config->expect_reject_early_data) {
          fprintf(stderr,
                  "Unexpectedly received data instead of 0-RTT reject.\n");
          return false;
        }

        // After a successful read, with or without False Start, the handshake
        // must be complete unless we are doing early data.
        if (!test_state->handshake_done && !SSL_early_data_accepted(ssl)) {
          fprintf(stderr, "handshake was not completed after SSL_read\n");
          return false;
        }

        // Clear the initial write, if unfinished.
        if (pending_initial_write) {
          if (WriteAll(ssl, kInitialWrite, strlen(kInitialWrite)) < 0) {
            return false;
          }
          pending_initial_write = false;
        }

        if (config->key_update &&
            !SSL_key_update(ssl, SSL_KEY_UPDATE_NOT_REQUESTED)) {
          fprintf(stderr, "SSL_key_update failed.\n");
          return false;
        }

        for (int i = 0; i < n; i++) {
          buf[i] ^= 0xff;
        }
        if (WriteAll(ssl, buf.get(), n) < 0) {
          return false;
        }
      }
    }
  }

  if (!config->is_server && !config->false_start &&
      !config->implicit_handshake &&
      // Session tickets are sent post-handshake in TLS 1.3.
      GetProtocolVersion(ssl) < TLS1_3_VERSION && test_state->got_new_session) {
    fprintf(stderr, "new session was established after the handshake\n");
    return false;
  }

  if (GetProtocolVersion(ssl) >= TLS1_3_VERSION && !config->is_server) {
    bool expect_new_session =
        !config->expect_no_session && !config->shim_shuts_down && !IsPAKE(ssl);
    if (expect_new_session != test_state->got_new_session) {
      fprintf(stderr,
              "new session was%s cached, but we expected the opposite\n",
              test_state->got_new_session ? "" : " not");
      return false;
    }

    if (expect_new_session) {
      bool got_early_data =
          !!SSL_SESSION_early_data_capable(test_state->new_session.get());
      if (config->expect_ticket_supports_early_data != got_early_data) {
        fprintf(stderr,
                "new session did%s support early data, but we expected the "
                "opposite\n",
                got_early_data ? "" : " not");
        return false;
      }

      if (config->expect_resumable_across_names.has_value()) {
        bool actual = !!SSL_SESSION_is_resumable_across_names(
            test_state->new_session.get());
        if (config->expect_resumable_across_names.value() != actual) {
          fprintf(stderr,
                  "new session did%s support cross-name resumption, but we "
                  "expected the opposite\n",
                  actual ? "" : " not");
          return false;
        }
      }
    }
  }

  if (out_session) {
    *out_session = std::move(test_state->new_session);
  }

  ret = DoShutdown(ssl);

  if (config->shim_shuts_down && config->check_close_notify) {
    // We initiate shutdown, so |SSL_shutdown| will return in two stages. First
    // it returns zero when our close_notify is sent, then one when the peer's
    // is received.
    if (ret != 0) {
      fprintf(stderr, "Unexpected SSL_shutdown result: %d != 0\n", ret);
      return false;
    }
    ret = DoShutdown(ssl);
  }

  if (ret != 1) {
    fprintf(stderr, "Unexpected SSL_shutdown result: %d != 1\n", ret);
    return false;
  }

  if (SSL_total_renegotiations(ssl) > 0) {
    if (SSL_SESSION_is_resumable(SSL_get_session(ssl))) {
      fprintf(stderr,
              "Renegotiations should never produce resumable sessions.\n");
      return false;
    }

    if (SSL_session_reused(ssl)) {
      fprintf(stderr, "Renegotiations should never resume sessions.\n");
      return false;
    }

    // Re-check authentication properties after a renegotiation. The reported
    // values should remain unchanged even if the server sent different SCT
    // lists.
    if (!CheckAuthProperties(ssl, is_resume, config)) {
      return false;
    }
  }

  if (SSL_total_renegotiations(ssl) != config->expect_total_renegotiations) {
    fprintf(stderr, "Expected %d renegotiations, got %d\n",
            config->expect_total_renegotiations, SSL_total_renegotiations(ssl));
    return false;
  }

  if (config->renegotiate_explicit &&
      SSL_total_renegotiations(ssl) != test_state->explicit_renegotiates) {
    fprintf(stderr, "Performed %d renegotiations, but triggered %d of them\n",
            SSL_total_renegotiations(ssl), test_state->explicit_renegotiates);
    return false;
  }

  return true;
}